

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall SQVM::Pop(SQVM *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQTable *pSVar4;
  long lVar5;
  
  pSVar3 = (this->_stack)._vals;
  lVar5 = this->_top + -1;
  this->_top = lVar5;
  pSVar4 = pSVar3[lVar5].super_SQObject._unVal.pTable;
  SVar2 = pSVar3[lVar5].super_SQObject._type;
  pSVar3[lVar5].super_SQObject._type = OT_NULL;
  pSVar3[lVar5].super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

inline T& operator[](SQUnsignedInteger pos) const{ return _vals[pos]; }